

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToEquivClassCP
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<unsigned_int> *result,
          codepoint_t baseOffset)

{
  CharSetNode *pCVar1;
  uint uVar2;
  CharSet<unsigned_int> *this_00;
  CharSet<unsigned_int> *allocator_00;
  bool bVar3;
  Char CVar4;
  uint uVar5;
  uint uVar6;
  int local_4c;
  codepoint_t local_48;
  int j;
  codepoint_t equivs [4];
  uint local_30;
  uint local_2c;
  uint acth;
  uint i;
  uint tblidx;
  codepoint_t baseOffset_local;
  CharSet<unsigned_int> *result_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  acth = 0;
  i = baseOffset;
  _tblidx = result;
  result_local = (CharSet<unsigned_int> *)allocator;
  allocator_local = (ArenaAllocator *)this;
  bVar3 = IsCompact(this);
  if (bVar3) {
    Sort(this);
    for (local_2c = 0; uVar2 = local_2c, uVar5 = GetCompactLength(this), uVar2 < uVar5;
        local_2c = local_2c + 1) {
      uVar5 = GetCompactCharU(this,local_2c);
      uVar5 = uVar5 + i;
      uVar6 = GetCompactCharU(this,local_2c);
      bVar3 = CaseInsensitive::RangeToEquivClass(&acth,uVar5,uVar6 + i,&local_30,&local_48);
      allocator_00 = result_local;
      this_00 = _tblidx;
      if (bVar3) {
        for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
          CharSet<unsigned_int>::Set(_tblidx,(ArenaAllocator *)result_local,(&local_48)[local_4c]);
        }
      }
      else {
        CVar4 = GetCompactChar(this,local_2c);
        CharSet<unsigned_int>::Set(this_00,(ArenaAllocator *)allocator_00,(ushort)CVar4 + i);
      }
    }
  }
  else {
    CharBitvec::ToEquivClass<unsigned_int>
              (&(this->rep).full.direct,(ArenaAllocator *)result_local,0,&acth,_tblidx,i);
    if ((this->rep).compact.countPlusOne != 0) {
      pCVar1 = (this->rep).full.root;
      (*pCVar1->_vptr_CharSetNode[8])(pCVar1,result_local,2,0,&acth,_tblidx,i);
    }
  }
  return;
}

Assistant:

void CharSet<char16>::ToEquivClassCP(ArenaAllocator* allocator, CharSet<codepoint_t>& result, codepoint_t baseOffset)
    {
        uint tblidx = 0;
        if (IsCompact())
        {
            Sort();
            for (uint i = 0; i < this->GetCompactLength(); i++)
            {
                uint acth;
                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                if (CaseInsensitive::RangeToEquivClass(tblidx, this->GetCompactCharU(i) + baseOffset, this->GetCompactCharU(i) + baseOffset, acth, equivs))
                {
                    for (int j = 0; j < CaseInsensitive::EquivClassSize; j++)
                    {
                        result.Set(allocator, equivs[j]);
                    }
                }
                else
                {
                    result.Set(allocator, this->GetCompactChar(i) + baseOffset);
                }
            }
        }
        else
        {
            rep.full.direct.ToEquivClass<codepoint_t>(allocator, 0, tblidx, result, baseOffset);
            if (rep.full.root != nullptr)
            {
                rep.full.root->ToEquivClassCP(allocator, CharSetNode::levels - 1, 0, tblidx, result, baseOffset);
            }
        }
    }